

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.h
# Opt level: O2

void __thiscall slang::ast::TypeArgFormatter::~TypeArgFormatter(TypeArgFormatter *this)

{
  ~TypeArgFormatter(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

class SLANG_EXPORT TypeArgFormatter : public DiagArgFormatter {
public:
    /// Constructs a new type arg formatter.
    TypeArgFormatter();

    /// Set the options to use when formatting types.
    void setOptions(const TypePrintingOptions& options) { printer.options = options; }

    void startMessage(const Diagnostic& diag) final;
    std::string format(const std::any& arg) final;

private:
    TypePrinter printer;
    flat_hash_set<const Type*> seenTypes;
    flat_hash_set<const Type*> typesToDisambiguate;
}